

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

sexp_conflict sexp_sweep(sexp_conflict ctx,size_t *sum_freed_ptr)

{
  char *pcVar1;
  sexp_uint_t sVar2;
  long lVar3;
  long lVar4;
  sexp_uint_t sVar5;
  ulong uVar6;
  long *in_RSI;
  sexp_conflict in_RDI;
  sexp_free_list_conflict s;
  sexp_free_list_conflict r;
  sexp_free_list_conflict q;
  sexp_conflict end;
  sexp_conflict p;
  sexp_heap_conflict h;
  size_t size;
  size_t sum_freed;
  size_t max_freed;
  size_t freed;
  sexp_conflict local_58;
  sexp_conflict local_50;
  sexp_conflict local_40;
  sexp_heap_conflict local_38;
  long local_28;
  ulong local_20;
  ulong local_18;
  
  local_20 = 0;
  local_28 = 0;
  for (local_38 = (in_RDI->value).context.heap; local_38 != (sexp_heap_conflict)0x0;
      local_38 = local_38->next) {
    local_40 = (sexp_conflict)(local_38->data + 0x20);
    local_50 = (sexp_conflict)local_38->free_list;
    pcVar1 = local_38->data;
    sVar2 = local_38->size;
    while (local_40 < (sexp_conflict)(pcVar1 + sVar2)) {
      for (local_58 = (local_50->value).type.name;
          local_58 != (sexp_conflict)0x0 && local_58 < local_40;
          local_58 = (local_58->value).type.name) {
        local_50 = local_58;
      }
      if (local_58 == local_40) {
        local_40 = (sexp_conflict)((long)&local_40->tag + *(long *)local_58);
      }
      else {
        sVar5 = sexp_allocated_bytes(in_RDI,local_40);
        uVar6 = sVar5 + 0x1f & 0xffffffffffffffe0;
        if (local_40->markedp == '\0') {
          local_28 = uVar6 + local_28;
          if (((sexp_conflict)((long)&local_50->tag + *(long *)local_50) == local_40) &&
             (local_50 != (sexp_conflict)local_38->free_list)) {
            if (((local_58 == (sexp_conflict)0x0) ||
                (lVar3._0_4_ = local_58->tag, lVar3._4_1_ = local_58->markedp,
                lVar3._5_3_ = *(undefined3 *)&local_58->field_0x5, lVar3 == 0)) ||
               ((sexp_conflict)((long)&local_40->tag + uVar6) != local_58)) {
              local_18 = *(long *)local_50 + uVar6;
              local_40 = (sexp_conflict)((long)&local_40->tag + uVar6);
            }
            else {
              (local_50->value).flonum = (double)(local_58->value).flonum;
              local_18 = *(long *)local_50 + uVar6 + *(long *)local_58;
              local_40 = (sexp_conflict)((long)&local_40->tag + *(long *)local_58 + uVar6);
            }
            local_50->tag = (undefined4)local_18;
            local_50->markedp = local_18._4_1_;
            *(undefined3 *)&local_50->field_0x5 = local_18._5_3_;
          }
          else {
            if ((local_58 == (sexp_conflict)0x0) ||
               ((lVar4._0_4_ = local_58->tag, lVar4._4_1_ = local_58->markedp,
                lVar4._5_3_ = *(undefined3 *)&local_58->field_0x5, lVar4 == 0 ||
                ((sexp_conflict)((long)&local_40->tag + uVar6) != local_58)))) {
              local_40->tag = (int)uVar6;
              local_40->markedp = (char)(uVar6 >> 0x20);
              *(int3 *)&local_40->field_0x5 = (int3)(uVar6 >> 0x28);
              (local_40->value).type.name = local_58;
              (local_50->value).type.name = local_40;
              local_18 = uVar6;
            }
            else {
              *(ulong *)local_40 = uVar6 + *(long *)local_58;
              (local_40->value).flonum = (double)(local_58->value).flonum;
              (local_50->value).type.name = local_40;
              local_18 = uVar6 + *(long *)local_58;
            }
            local_40 = (sexp_conflict)((long)&local_40->tag + local_18);
          }
          if (local_20 < local_18) {
            local_20 = local_18;
          }
        }
        else {
          local_40->markedp = '\0';
          local_40 = (sexp_conflict)((long)&local_40->tag + uVar6);
        }
      }
    }
  }
  if (in_RSI != (long *)0x0) {
    *in_RSI = local_28;
  }
  return (sexp_conflict)(local_20 << 1 | 1);
}

Assistant:

sexp sexp_sweep (sexp ctx, size_t *sum_freed_ptr) {
  size_t freed, max_freed=0, sum_freed=0, size;
  sexp_heap h = sexp_context_heap(ctx);
  sexp p, end;
  sexp_free_list q, r, s;
  /* scan over the whole heap */
  for ( ; h; h=h->next) {
    p = sexp_heap_first_block(h);
    q = h->free_list;
    end = sexp_heap_end(h);
    while (p < end) {
      /* find the preceding and succeeding free list pointers */
      for (r=q->next; r && ((char*)r<(char*)p); q=r, r=r->next)
        ;
      if ((char*)r == (char*)p) { /* this is a free block, skip it */
        p = (sexp) (((char*)p) + r->size);
        continue;
      }
      size = sexp_heap_align(sexp_allocated_bytes(ctx, p));
#if SEXP_USE_DEBUG_GC > 1
      if (!sexp_valid_object_p(ctx, p))
        fprintf(stderr, SEXP_BANNER("%p sweep: invalid object at %p"), ctx, p);
      if ((char*)q + q->size > (char*)p)
        fprintf(stderr, SEXP_BANNER("%p sweep: bad size at %p < %p + %lu"),
                ctx, p, q, q->size);
      if (r && ((char*)p)+size > (char*)r)
        fprintf(stderr, SEXP_BANNER("%p sweep: bad size at %p + %lu > %p"),
                ctx, p, size, r);
#endif
      if (!sexp_markedp(p)) {
        /* free p */
        sum_freed += size;
        if (((((char*)q) + q->size) == (char*)p) && (q != h->free_list)) {
          /* merge q with p */
          if (r && r->size && ((((char*)p)+size) == (char*)r)) {
            /* ... and with r */
            q->next = r->next;
            freed = q->size + size + r->size;
            p = (sexp) (((char*)p) + size + r->size);
          } else {
            freed = q->size + size;
            p = (sexp) (((char*)p)+size);
          }
          q->size = freed;
        } else {
          s = (sexp_free_list)p;
          if (r && r->size && ((((char*)p)+size) == (char*)r)) {
            /* merge p with r */
            s->size = size + r->size;
            s->next = r->next;
            q->next = s;
            freed = size + r->size;
          } else {
            s->size = size;
            s->next = r;
            q->next = s;
            freed = size;
          }
          p = (sexp) (((char*)p)+freed);
        }
        if (freed > max_freed)
          max_freed = freed;
      } else {
        sexp_markedp(p) = 0;
        p = (sexp) (((char*)p)+size);
      }
    }
  }
  if (sum_freed_ptr) *sum_freed_ptr = sum_freed;
  return sexp_make_fixnum(max_freed);
}